

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::addCE32
          (CollationDataBuilder *this,UnicodeString *prefix,UnicodeString *s,uint32_t ce32,
          UErrorCode *errorCode)

{
  int index_00;
  CollationData *this_00;
  bool bVar1;
  UBool UVar2;
  int8_t iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  ConditionalCE32 *pCVar6;
  UnicodeString *this_01;
  bool local_159;
  int32_t index_2;
  int8_t cmp;
  ConditionalCE32 *nextCond;
  int32_t index_1;
  int32_t next;
  UnicodeString context;
  UnicodeString suffix;
  uint32_t contextCE32;
  UnicodeString local_a0;
  int32_t local_5c;
  ConditionalCE32 *pCStack_58;
  int32_t index;
  ConditionalCE32 *cond_1;
  ConditionalCE32 *cond;
  bool local_3d;
  uint32_t baseCE32;
  int iStack_38;
  UBool hasContext;
  uint32_t oldCE32;
  int32_t cLength;
  UChar32 c;
  UErrorCode *errorCode_local;
  UnicodeString *pUStack_20;
  uint32_t ce32_local;
  UnicodeString *s_local;
  UnicodeString *prefix_local;
  CollationDataBuilder *this_local;
  
  _cLength = errorCode;
  errorCode_local._4_4_ = ce32;
  pUStack_20 = s;
  s_local = prefix;
  prefix_local = (UnicodeString *)this;
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    UVar2 = UnicodeString::isEmpty(pUStack_20);
    if (UVar2 == '\0') {
      if ((this->trie == (UTrie2 *)0x0) || (UVar2 = utrie2_isFrozen_63(this->trie), UVar2 != '\0'))
      {
        *_cLength = U_INVALID_STATE_ERROR;
      }
      else {
        oldCE32 = UnicodeString::char32At(pUStack_20,0);
        iStack_38 = 2;
        if (oldCE32 < 0x10000) {
          iStack_38 = 1;
        }
        baseCE32 = utrie2_get32_63(this->trie,oldCE32);
        UVar2 = UnicodeString::isEmpty(s_local);
        local_159 = true;
        if (UVar2 != '\0') {
          iVar4 = UnicodeString::length(pUStack_20);
          local_159 = iStack_38 < iVar4;
        }
        local_3d = local_159;
        if (baseCE32 == 0xc0) {
          this_00 = this->base;
          uVar5 = CollationData::getCE32(this->base,oldCE32);
          cond._4_4_ = CollationData::getFinalCE32(this_00,uVar5);
          if ((local_3d != false) || (UVar2 = Collation::ce32HasContext(cond._4_4_), UVar2 != '\0'))
          {
            baseCE32 = copyFromBaseCE32(this,oldCE32,cond._4_4_,'\x01',_cLength);
            utrie2_set32_63(this->trie,oldCE32,baseCE32,_cLength);
            UVar2 = ::U_FAILURE(*_cLength);
            if (UVar2 != '\0') {
              return;
            }
          }
        }
        if (local_3d == false) {
          UVar2 = isBuilderContextCE32(baseCE32);
          if (UVar2 == '\0') {
            utrie2_set32_63(this->trie,oldCE32,errorCode_local._4_4_,_cLength);
          }
          else {
            pCVar6 = getConditionalCE32ForCE32(this,baseCE32);
            pCVar6->builtCE32 = 1;
            pCVar6->ce32 = errorCode_local._4_4_;
          }
        }
        else {
          UVar2 = isBuilderContextCE32(baseCE32);
          if (UVar2 == '\0') {
            UnicodeString::UnicodeString(&local_a0,L'\0');
            iVar4 = addConditionalCE32(this,&local_a0,baseCE32,_cLength);
            UnicodeString::~UnicodeString(&local_a0);
            local_5c = iVar4;
            UVar2 = ::U_FAILURE(*_cLength);
            if (UVar2 != '\0') {
              return;
            }
            uVar5 = makeBuilderContextCE32(local_5c);
            utrie2_set32_63(this->trie,oldCE32,uVar5,_cLength);
            UnicodeSet::add(&this->contextChars,oldCE32);
            pCStack_58 = getConditionalCE32(this,local_5c);
          }
          else {
            pCStack_58 = getConditionalCE32ForCE32(this,baseCE32);
            pCStack_58->builtCE32 = 1;
          }
          UnicodeString::UnicodeString
                    ((UnicodeString *)((long)&context.fUnion + 0x30),pUStack_20,iStack_38);
          iVar4 = UnicodeString::length(s_local);
          UnicodeString::UnicodeString((UnicodeString *)&index_1,(UChar)iVar4);
          this_01 = UnicodeString::append((UnicodeString *)&index_1,s_local);
          UnicodeString::append(this_01,(UnicodeString *)((long)&context.fUnion + 0x30));
          UnicodeSet::addAll(&this->unsafeBackwardSet,
                             (UnicodeString *)((long)&context.fUnion + 0x30));
          pCVar6 = pCStack_58;
          do {
            pCStack_58 = pCVar6;
            index_00 = pCStack_58->next;
            if (index_00 < 0) {
              iVar4 = addConditionalCE32(this,(UnicodeString *)&index_1,errorCode_local._4_4_,
                                         _cLength);
              UVar2 = ::U_FAILURE(*_cLength);
              if (UVar2 == '\0') {
                pCStack_58->next = iVar4;
                goto LAB_0029e9aa;
              }
              bVar1 = true;
              goto LAB_0029e9b4;
            }
            pCVar6 = getConditionalCE32(this,index_00);
            iVar3 = UnicodeString::compare((UnicodeString *)&index_1,&pCVar6->context);
            if (iVar3 < '\0') {
              iVar4 = addConditionalCE32(this,(UnicodeString *)&index_1,errorCode_local._4_4_,
                                         _cLength);
              UVar2 = ::U_FAILURE(*_cLength);
              if (UVar2 != '\0') {
                bVar1 = true;
                goto LAB_0029e9b4;
              }
              pCStack_58->next = iVar4;
              pCVar6 = getConditionalCE32(this,iVar4);
              pCVar6->next = index_00;
              goto LAB_0029e9aa;
            }
          } while (iVar3 != '\0');
          pCVar6->ce32 = errorCode_local._4_4_;
LAB_0029e9aa:
          bVar1 = false;
LAB_0029e9b4:
          UnicodeString::~UnicodeString((UnicodeString *)&index_1);
          UnicodeString::~UnicodeString((UnicodeString *)((long)&context.fUnion + 0x30));
          if (bVar1) {
            return;
          }
        }
        this->modified = '\x01';
      }
    }
    else {
      *_cLength = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

void
CollationDataBuilder::addCE32(const UnicodeString &prefix, const UnicodeString &s,
                              uint32_t ce32, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(s.isEmpty()) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if(trie == NULL || utrie2_isFrozen(trie)) {
        errorCode = U_INVALID_STATE_ERROR;
        return;
    }
    UChar32 c = s.char32At(0);
    int32_t cLength = U16_LENGTH(c);
    uint32_t oldCE32 = utrie2_get32(trie, c);
    UBool hasContext = !prefix.isEmpty() || s.length() > cLength;
    if(oldCE32 == Collation::FALLBACK_CE32) {
        // First tailoring for c.
        // If c has contextual base mappings or if we add a contextual mapping,
        // then copy the base mappings.
        // Otherwise we just override the base mapping.
        uint32_t baseCE32 = base->getFinalCE32(base->getCE32(c));
        if(hasContext || Collation::ce32HasContext(baseCE32)) {
            oldCE32 = copyFromBaseCE32(c, baseCE32, TRUE, errorCode);
            utrie2_set32(trie, c, oldCE32, &errorCode);
            if(U_FAILURE(errorCode)) { return; }
        }
    }
    if(!hasContext) {
        // No prefix, no contraction.
        if(!isBuilderContextCE32(oldCE32)) {
            utrie2_set32(trie, c, ce32, &errorCode);
        } else {
            ConditionalCE32 *cond = getConditionalCE32ForCE32(oldCE32);
            cond->builtCE32 = Collation::NO_CE32;
            cond->ce32 = ce32;
        }
    } else {
        ConditionalCE32 *cond;
        if(!isBuilderContextCE32(oldCE32)) {
            // Replace the simple oldCE32 with a builder context CE32
            // pointing to a new ConditionalCE32 list head.
            int32_t index = addConditionalCE32(UnicodeString((UChar)0), oldCE32, errorCode);
            if(U_FAILURE(errorCode)) { return; }
            uint32_t contextCE32 = makeBuilderContextCE32(index);
            utrie2_set32(trie, c, contextCE32, &errorCode);
            contextChars.add(c);
            cond = getConditionalCE32(index);
        } else {
            cond = getConditionalCE32ForCE32(oldCE32);
            cond->builtCE32 = Collation::NO_CE32;
        }
        UnicodeString suffix(s, cLength);
        UnicodeString context((UChar)prefix.length());
        context.append(prefix).append(suffix);
        unsafeBackwardSet.addAll(suffix);
        for(;;) {
            // invariant: context > cond->context
            int32_t next = cond->next;
            if(next < 0) {
                // Append a new ConditionalCE32 after cond.
                int32_t index = addConditionalCE32(context, ce32, errorCode);
                if(U_FAILURE(errorCode)) { return; }
                cond->next = index;
                break;
            }
            ConditionalCE32 *nextCond = getConditionalCE32(next);
            int8_t cmp = context.compare(nextCond->context);
            if(cmp < 0) {
                // Insert a new ConditionalCE32 between cond and nextCond.
                int32_t index = addConditionalCE32(context, ce32, errorCode);
                if(U_FAILURE(errorCode)) { return; }
                cond->next = index;
                getConditionalCE32(index)->next = next;
                break;
            } else if(cmp == 0) {
                // Same context as before, overwrite its ce32.
                nextCond->ce32 = ce32;
                break;
            }
            cond = nextCond;
        }
    }
    modified = TRUE;
}